

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  int iVar2;
  MemoryManager *manager;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar3;
  XSerializeEngine *manager_00;
  DTDAttDef *valueToAdopt;
  undefined4 extraout_var;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  XMLSize_t itemIndex;
  ulong uVar4;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  manager_00 = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    pRVar3 = *objToLoad;
    if (pRVar3 == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
      manager = XSerializeEngine::getMemoryManager(serEng);
      pRVar3 = (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x38,manager);
      manager_00 = (XSerializeEngine *)XSerializeEngine::getMemoryManager(serEng);
      RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::RefHashTableOf
                (pRVar3,hashModulus,toAdopt,(MemoryManager *)manager_00);
      *objToLoad = pRVar3;
    }
    XSerializeEngine::registerObject(serEng,pRVar3);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    __buf = extraout_RDX;
    for (uVar4 = 0; uVar4 < itemNumber; uVar4 = uVar4 + 1) {
      valueToAdopt = (DTDAttDef *)XSerializeEngine::read(serEng,0x4334a8,__buf,(size_t)manager_00);
      pRVar3 = *objToLoad;
      iVar2 = (*(valueToAdopt->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                        (valueToAdopt);
      RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::put
                (pRVar3,(void *)CONCAT44(extraout_var,iVar2),valueToAdopt);
      __buf = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<DTDAttDef>** objToLoad
                                   , int
                                   , bool                        toAdopt
                                   , XSerializeEngine&           serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {

        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<DTDAttDef>(
                                                       hashModulus
                                                     , toAdopt
                                                     , serEng.getMemoryManager()
                                                      );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DTDAttDef*  data;
            serEng>>data;

            (*objToLoad)->put((void*)data->getFullName(), data);
        }
    }
}